

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O1

ggml_tensor * __thiscall test_sqr::build_graph(test_sqr *this,ggml_context *ctx)

{
  undefined8 uVar1;
  ggml_tensor *pgVar2;
  
  uVar1 = ggml_new_tensor(ctx,this->type,4,&this->ne);
  test_case::add_sentinel(&this->super_test_case,ctx);
  ggml_set_param(ctx,uVar1);
  ggml_set_name(uVar1,"a");
  pgVar2 = (ggml_tensor *)ggml_sqr(ctx,uVar1);
  ggml_set_name(pgVar2,"out");
  return pgVar2;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        ggml_tensor * a = ggml_new_tensor(ctx, type, 4, ne.data());
        ggml_set_param(ctx, a);
        ggml_set_name(a, "a");

        ggml_tensor * out = ggml_sqr(ctx, a);
        ggml_set_name(out, "out");

        return out;
    }